

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this,
          char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  
  pEVar1 = this->ptr;
  pEVar3 = this->pos;
  while (pEVar2 = pEVar3, pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    pEVar3 = pEVar2 + -1;
    if (pEVar2[-1].value.ptr != (SegmentReader *)0x0) {
      pEVar2[-1].value.ptr = (SegmentReader *)0x0;
      (**(pEVar2[-1].value.disposer)->_vptr_Disposer)();
      pEVar3 = this->pos;
    }
  }
  return (int)pEVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }